

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# plutovg-rasterize.c
# Opt level: O3

void plutovg_span_buffer_init_rect
               (plutovg_span_buffer_t *span_buffer,int x,int y,int width,int height)

{
  int iVar1;
  plutovg_span_t *ppVar2;
  long lVar3;
  int capacity;
  int iVar4;
  
  (span_buffer->spans).size = 0;
  iVar4 = (span_buffer->spans).capacity;
  if (iVar4 < height) {
    iVar1 = 8;
    if (iVar4 != 0) {
      iVar1 = iVar4;
    }
    do {
      iVar4 = iVar1;
      iVar1 = iVar4 * 2;
    } while (iVar4 < height);
    ppVar2 = (plutovg_span_t *)realloc((span_buffer->spans).data,(long)iVar4 << 4);
    (span_buffer->spans).data = ppVar2;
    (span_buffer->spans).capacity = iVar4;
  }
  else {
    ppVar2 = (span_buffer->spans).data;
  }
  if (0 < height) {
    lVar3 = 0;
    iVar4 = y;
    do {
      *(int *)((long)&ppVar2->x + lVar3) = x;
      *(int *)((long)&ppVar2->y + lVar3) = iVar4;
      *(int *)((long)&ppVar2->len + lVar3) = width;
      (&ppVar2->coverage)[lVar3] = 0xff;
      iVar4 = iVar4 + 1;
      lVar3 = lVar3 + 0x10;
    } while ((ulong)(uint)height << 4 != lVar3);
  }
  span_buffer->x = x;
  span_buffer->y = y;
  span_buffer->w = width;
  span_buffer->h = height;
  (span_buffer->spans).size = height;
  return;
}

Assistant:

void plutovg_span_buffer_init_rect(plutovg_span_buffer_t* span_buffer, int x, int y, int width, int height)
{
    plutovg_array_clear(span_buffer->spans);
    plutovg_array_ensure(span_buffer->spans, height);
    plutovg_span_t* spans = span_buffer->spans.data;
    for(int i = 0; i < height; i++) {
        spans[i].x = x;
        spans[i].y = y + i;
        spans[i].len = width;
        spans[i].coverage = 255;
    }

    span_buffer->x = x;
    span_buffer->y = y;
    span_buffer->w = width;
    span_buffer->h = height;
    span_buffer->spans.size = height;
}